

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int av1_compute_qdelta_by_rate
              (AV1_COMP *cpi,FRAME_TYPE frame_type,int qindex,double rate_target_ratio)

{
  int iVar1;
  int iVar2;
  int qindex_00;
  int iVar3;
  int iVar4;
  int low;
  
  iVar1 = av1_rc_bits_per_mb(cpi,frame_type,qindex,1.0,0);
  iVar4 = (cpi->rc).worst_quality;
  iVar3 = (cpi->rc).best_quality;
  if (iVar3 < iVar4) {
    do {
      qindex_00 = iVar3 + iVar4 >> 1;
      iVar2 = av1_rc_bits_per_mb(cpi,frame_type,qindex_00,1.0,0);
      if ((int)((double)iVar1 * rate_target_ratio) < iVar2) {
        iVar3 = qindex_00 + 1;
        qindex_00 = iVar4;
      }
      iVar4 = qindex_00;
    } while (iVar3 < iVar4);
  }
  return iVar3 - qindex;
}

Assistant:

int av1_compute_qdelta_by_rate(const AV1_COMP *cpi, FRAME_TYPE frame_type,
                               int qindex, double rate_target_ratio) {
  const RATE_CONTROL *rc = &cpi->rc;

  // Look up the current projected bits per block for the base index
  const int base_bits_per_mb =
      av1_rc_bits_per_mb(cpi, frame_type, qindex, 1.0, 0);

  // Find the target bits per mb based on the base value and given ratio.
  const int target_bits_per_mb = (int)(rate_target_ratio * base_bits_per_mb);

  const int target_index = find_qindex_by_rate(
      cpi, target_bits_per_mb, frame_type, rc->best_quality, rc->worst_quality);
  return target_index - qindex;
}